

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
jbcoin::STTx::checkSingleSign_abi_cxx11_
          (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,STTx *this)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  optional<jbcoin::KeyType> oVar4;
  size_t in_R8;
  Blob spk;
  Blob data;
  Blob signature;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  PublicKey local_80;
  pointer local_50;
  long local_48;
  pointer local_40;
  long local_38;
  Slice local_30;
  
  bVar1 = STObject::isFieldPresent(&this->super_STObject,(SField *)sfSigners);
  if (bVar1) {
    local_80.size_ = local_80.size_ & 0xffffffffffffff00;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_const_char_(&)[36],_true>
              (__return_storage_ptr__,(bool *)&local_80,
               (char (*) [36])"Cannot both single- and multi-sign.");
  }
  else {
    uVar2 = STObject::getFlags(&this->super_STObject);
    STObject::getFieldVL((Blob *)&local_c8,&this->super_STObject,(SField *)sfSigningPubKey);
    local_80.buf_._0_8_ =
         (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
         (long)local_c8._M_impl.super__Vector_impl_data._M_start;
    local_80.size_ = (size_t)local_c8._M_impl.super__Vector_impl_data._M_start;
    oVar4 = publicKeyType((Slice *)&local_80);
    if (((ulong)oVar4.super_type & 1) == 0) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
    }
    else {
      STObject::getFieldVL((Blob *)&local_98,&this->super_STObject,(SField *)sfTxnSignature);
      getSigningData((Blob *)&local_b0,this);
      local_30.size_ =
           (long)local_c8._M_impl.super__Vector_impl_data._M_finish -
           (long)local_c8._M_impl.super__Vector_impl_data._M_start;
      local_30.data_ = local_c8._M_impl.super__Vector_impl_data._M_start;
      PublicKey::PublicKey(&local_80,&local_30);
      local_38 = (long)local_b0._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_b0._M_impl.super__Vector_impl_data._M_start;
      local_40 = local_b0._M_impl.super__Vector_impl_data._M_start;
      local_48 = (long)local_98._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98._M_impl.super__Vector_impl_data._M_start;
      local_50 = local_98._M_impl.super__Vector_impl_data._M_start;
      iVar3 = verify((EVP_PKEY_CTX *)&local_80,(uchar *)&local_40,(size_t)&local_50,
                     (uchar *)(ulong)(uVar2 >> 0x1f),in_R8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c8);
      if ((char)iVar3 != '\0') {
        local_80.size_ = CONCAT71(local_80.size_._1_7_,1);
        std::
        pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<bool,_const_char_(&)[1],_true>
                  (__return_storage_ptr__,(bool *)&local_80,(char (*) [1])"");
        return __return_storage_ptr__;
      }
    }
    local_80.size_ = local_80.size_ & 0xffffffffffffff00;
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<bool,_const_char_(&)[19],_true>
              (__return_storage_ptr__,(bool *)&local_80,(char (*) [19])"Invalid signature.");
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<bool, std::string> STTx::checkSingleSign () const
{
    // We don't allow both a non-empty sfSigningPubKey and an sfSigners.
    // That would allow the transaction to be signed two ways.  So if both
    // fields are present the signature is invalid.
    if (isFieldPresent (sfSigners))
        return {false, "Cannot both single- and multi-sign."};

    bool validSig = false;
    try
    {
        bool const fullyCanonical = (getFlags() & tfFullyCanonicalSig);
        auto const spk = getFieldVL (sfSigningPubKey);

        if (publicKeyType (makeSlice(spk)))
        {
            Blob const signature = getFieldVL (sfTxnSignature);
            Blob const data = getSigningData (*this);

            validSig = verify (
                PublicKey (makeSlice(spk)),
                makeSlice(data),
                makeSlice(signature),
                fullyCanonical);
        }
    }
    catch (std::exception const&)
    {
        // Assume it was a signature failure.
        validSig = false;
    }
    if (validSig == false)
        return {false, "Invalid signature."};

    return {true, ""};
}